

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O1

size_t __thiscall tcmalloc::CentralFreeList::OverheadBytes(CentralFreeList *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  LOCK();
  bVar3 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  local_20.lock_ = &this->lock_;
  if (!bVar3) {
    SpinLock::SlowLock(&this->lock_);
  }
  if (this->size_class_ == 0) {
    sVar2 = 0;
  }
  else {
    uVar1 = this->size_class_ & 0xffffffff;
    sVar2 = ((ulong)(*(long *)(&DAT_0012ea48 + uVar1 * 8) << 0xd) %
            (ulong)(long)(int)(&DAT_0012e844)[uVar1]) * this->num_spans_;
  }
  SpinLockHolder::~SpinLockHolder(&local_20);
  return sVar2;
}

Assistant:

size_t CentralFreeList::OverheadBytes() {
  SpinLockHolder h(&lock_);
  if (size_class_ == 0) {  // 0 holds the 0-sized allocations
    return 0;
  }
  const size_t pages_per_span = Static::sizemap()->class_to_pages(size_class_);
  const size_t object_size = Static::sizemap()->class_to_size(size_class_);
  ASSERT(object_size > 0);
  const size_t overhead_per_span = (pages_per_span * kPageSize) % object_size;
  return num_spans_ * overhead_per_span;
}